

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O3

int ncnn::conv3x3s1_winograd43_int8(Mat *bottom_blob,Mat *top_blob,Mat *AT,int nT,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Mat *pMVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Mat *top_blob_00;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  int *piVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  undefined1 (*pauVar29) [16];
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int *piVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int m_2;
  int m_3;
  uint uVar41;
  undefined1 (*pauVar42) [16];
  int *piVar43;
  undefined1 (*pauVar44) [16];
  int iVar45;
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int TILE_M;
  int TILE_K;
  int TILE_N;
  Mat m;
  int tmp [4] [6] [2];
  Allocator *_allocator;
  ulong local_3b0;
  uint local_374;
  Mat *local_370;
  ulong local_368;
  ulong local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  long local_338;
  long local_330;
  int local_328;
  int local_324;
  int local_320;
  uint local_31c;
  Mat local_318;
  ulong local_2c8;
  long local_2c0;
  void *local_2b8;
  int local_2b0;
  int local_2ac;
  Mat local_2a8;
  ulong local_260;
  ulong local_258;
  long local_250;
  ulong local_248;
  Mat local_240;
  ulong local_1f8;
  Mat *local_1f0;
  long local_1e8;
  void *local_1e0;
  long local_1d8;
  ulong local_1d0;
  size_t local_1c8;
  long local_1c0;
  Mat local_1b8;
  int aiStack_170 [2];
  undefined1 local_168 [16];
  int aiStack_158 [20];
  undefined1 local_108 [6] [16];
  undefined1 local_a8 [6] [16];
  undefined1 local_48 [16];
  
  iVar7 = cpu_support_x86_avx_vnni();
  if (iVar7 != 0) {
    iVar7 = conv3x3s1_winograd43_int8_avxvnni(bottom_blob,top_blob,AT,nT,opt);
    return iVar7;
  }
  iVar7 = cpu_support_x86_avx2();
  if (iVar7 != 0) {
    iVar7 = conv3x3s1_winograd43_int8_avx2(bottom_blob,top_blob,AT,nT,opt);
    return iVar7;
  }
  iVar7 = cpu_support_x86_xop();
  if (iVar7 != 0) {
    iVar7 = conv3x3s1_winograd43_int8_xop(bottom_blob,top_blob,AT,nT,opt);
    return iVar7;
  }
  uVar1 = top_blob->w;
  uVar2 = top_blob->h;
  auVar47._4_4_ = uVar2;
  auVar47._0_4_ = uVar1;
  auVar49._8_4_ = 3;
  auVar49._0_8_ = 0x300000003;
  auVar49._12_4_ = 3;
  auVar47._8_8_ = 0;
  auVar47 = vpaddd_avx(auVar47,auVar49);
  auVar49 = vpsrad_avx(auVar47,0x1f);
  auVar49 = vpsrld_avx(auVar49,0x1e);
  auVar47 = vpaddd_avx(auVar47,auVar49);
  auVar47 = vpsrad_avx(auVar47,2);
  uVar20 = top_blob->elempack * top_blob->c;
  uVar41 = auVar47._4_4_ * auVar47._0_4_;
  uVar18 = bottom_blob->elempack * bottom_blob->c;
  local_370 = top_blob;
  get_optimal_tile_mnk_int8(uVar20,uVar41,uVar18,(int *)&local_374,(int *)&local_31c,&local_320,nT);
  uVar27 = local_31c;
  iVar8 = local_320;
  local_328 = (int)(local_374 + uVar20 + -1) / (int)local_374;
  iVar30 = (int)(local_31c + uVar41 + -1) / (int)local_31c;
  iVar12 = (int)(uVar18 + local_320 + -1) / local_320;
  iVar7 = local_320 * local_31c;
  _allocator = opt->workspace_allocator;
  local_2a8.cstep = 0;
  local_2a8.data = (void *)0x0;
  local_2a8.refcount._0_4_ = 0;
  local_2a8.refcount._4_4_ = 0;
  local_2a8.elemsize = 0;
  local_2a8.elempack = 0;
  local_2a8.allocator = (Allocator *)0x0;
  local_2a8.dims = 0;
  local_2a8.w = 0;
  local_2a8.h = 0;
  local_2a8.d = 0;
  local_2a8.c = 0;
  local_360 = (ulong)uVar41;
  local_358 = (ulong)uVar18;
  local_1f8 = (ulong)uVar20;
  Mat::create(&local_2a8,iVar7,0x24,iVar12,iVar30,4,_allocator);
  iVar13 = -100;
  if ((local_2a8.data == (void *)0x0) || ((long)local_2a8.c * local_2a8.cstep == 0))
  goto LAB_00221f96;
  iVar30 = iVar30 * iVar12;
  iVar7 = iVar7 * 0x24;
  local_1f0 = AT;
  if ((nT < 2) || (nT <= iVar30)) {
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,iVar7,1,nT,4,opt->workspace_allocator);
    if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0)) {
      piVar35 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      iVar13 = -100;
      if (piVar35 == (int *)0x0) goto LAB_00221f96;
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 != 0) goto LAB_00221f96;
      if (local_1b8.allocator != (Allocator *)0x0) {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        iVar13 = -100;
        goto LAB_00221f96;
      }
      goto LAB_00220cc4;
    }
    if (0 < iVar30) {
      iVar7 = 0;
      do {
        iVar13 = uVar27 * (iVar7 / iVar12);
        iVar31 = iVar8 * (iVar7 % iVar12);
        uVar18 = (int)local_360 - iVar13;
        if ((int)uVar27 < (int)uVar18) {
          uVar18 = uVar27;
        }
        iVar45 = (int)local_358 - iVar31;
        if (iVar8 < iVar45) {
          iVar45 = iVar8;
        }
        iVar14 = get_omp_thread_num();
        local_318.elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
        local_318.data =
             (void *)((long)iVar14 * local_1b8.cstep * local_318.elemsize + (long)local_1b8.data);
        local_318.refcount._0_4_ = 0;
        local_318.refcount._4_4_ = 0;
        local_318.elempack = local_1b8.elempack;
        local_318.allocator = local_1b8.allocator;
        local_318.w = local_1b8.w;
        local_318.h = local_1b8.h;
        local_318.d = 1;
        local_318.c = local_1b8.d;
        local_318.dims = local_1b8.dims + -1;
        local_318.cstep =
             (local_318.elemsize * (long)local_1b8.h * (long)local_1b8.w + 0xf & 0xfffffffffffffff0)
             / local_318.elemsize;
        if (local_1b8.dims == 4) {
          local_318.cstep = (long)local_1b8.h * (long)local_1b8.w;
        }
        conv3x3s1_winograd43_transform_input_tile_int8
                  (bottom_blob,&local_318,iVar13,uVar18,iVar31,iVar45,(int)_allocator);
        local_240.cstep = (long)local_2a8.h * (long)local_2a8.w;
        local_240.data =
             (void *)((long)local_2a8.data +
                     (uint)(iVar7 % iVar12) * local_2a8.elemsize * local_240.cstep +
                     (long)(iVar7 / iVar12) * local_2a8.cstep * local_2a8.elemsize);
        local_240.refcount = (int *)0x0;
        local_240.elemsize = local_2a8.elemsize;
        local_240.elempack = local_2a8.elempack;
        local_240.allocator = local_2a8.allocator;
        local_240.dims = 2;
        local_240.w = local_2a8.w;
        local_240.h = local_2a8.h;
        local_240.d = 1;
        local_240.c = 1;
        transpose_pack_B_tile_int8(&local_318,&local_240,0x24,uVar18,iVar45,(int)local_240.cstep);
        iVar7 = iVar7 + 1;
      } while (iVar30 != iVar7);
    }
    uVar26 = local_358;
    uVar17 = local_360;
    piVar35 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar35 != (int *)0x0) {
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) goto LAB_00220cdf;
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,iVar7,4,opt->workspace_allocator);
    uVar26 = local_358;
    if ((local_1b8.data == (void *)0x0) || ((long)local_1b8.c * local_1b8.cstep == 0)) {
      piVar35 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      iVar13 = -100;
      if (piVar35 == (int *)0x0) goto LAB_00221f96;
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 != 0) goto LAB_00221f96;
      if (local_1b8.allocator != (Allocator *)0x0) {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        iVar13 = -100;
        goto LAB_00221f96;
      }
LAB_00220cc4:
      iVar13 = -100;
      if (local_1b8.data != (void *)0x0) {
        free(local_1b8.data);
        iVar13 = -100;
      }
      goto LAB_00221f96;
    }
    if (0 < iVar30) {
      iVar7 = 0;
      do {
        iVar13 = uVar27 * (iVar7 / iVar12);
        iVar31 = iVar8 * (int)((long)iVar7 % (long)iVar12);
        uVar18 = (int)local_360 - iVar13;
        if ((int)uVar27 < (int)uVar18) {
          uVar18 = uVar27;
        }
        iVar45 = (int)uVar26 - iVar31;
        if (iVar8 < iVar45) {
          iVar45 = iVar8;
        }
        conv3x3s1_winograd43_transform_input_tile_int8
                  (bottom_blob,&local_1b8,iVar13,uVar18,iVar31,iVar45,(int)_allocator);
        local_318.cstep = (long)local_2a8.h * (long)local_2a8.w;
        local_318.data =
             (void *)((long)local_2a8.data +
                     ((long)iVar7 % (long)iVar12 & 0xffffffffU) * local_2a8.elemsize *
                     local_318.cstep + (long)(iVar7 / iVar12) * local_2a8.cstep * local_2a8.elemsize
                     );
        local_318.refcount._0_4_ = 0;
        local_318.refcount._4_4_ = 0;
        local_318.elemsize = local_2a8.elemsize;
        local_318.elempack = local_2a8.elempack;
        local_318.allocator = local_2a8.allocator;
        local_318.dims = 2;
        local_318.w = local_2a8.w;
        local_318.h = local_2a8.h;
        local_318.d = 1;
        local_318.c = 1;
        transpose_pack_B_tile_int8(&local_1b8,&local_318,0x24,uVar18,iVar45,(int)local_318.cstep);
        iVar7 = iVar7 + 1;
      } while (iVar30 != iVar7);
    }
    uVar17 = local_360;
    piVar35 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar35 != (int *)0x0) {
      LOCK();
      *piVar35 = *piVar35 + -1;
      UNLOCK();
      if (*piVar35 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
LAB_00220cdf:
          uVar17 = local_360;
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  uVar27 = local_31c;
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  Mat::create(&local_318,local_374 * local_31c * 0x24,1,nT,4,opt->workspace_allocator);
  iVar13 = -100;
  if ((local_318.data != (void *)0x0) && ((long)local_318.c * local_318.cstep != 0)) {
    if (0 < local_328) {
      iVar7 = 0;
      do {
        uVar20 = local_374;
        iVar8 = get_omp_thread_num();
        uVar41 = uVar20 * iVar7;
        uVar18 = (int)local_1f8 - uVar41;
        if ((int)uVar20 < (int)uVar18) {
          uVar18 = uVar20;
        }
        local_2b0 = iVar7;
        if (0 < (int)uVar17) {
          top_blob_00 = (Mat *)((long)iVar8 * local_318.cstep * local_318.elemsize +
                               (long)local_318.data);
          local_1d8 = (long)(int)uVar18;
          local_250 = (long)(int)uVar41;
          uVar25 = 0;
          local_258 = (ulong)uVar41;
          local_248 = (ulong)uVar18;
          do {
            pMVar6 = local_1f0;
            iVar7 = local_320;
            uVar20 = (int)uVar17 - (int)uVar25;
            if ((int)uVar27 < (int)uVar20) {
              uVar20 = uVar27;
            }
            local_350 = (ulong)uVar20;
            local_368 = uVar25;
            if (0 < (int)uVar26) {
              iVar13 = (int)local_258;
              lVar10 = (long)(int)local_374;
              uVar17 = local_258 & 0xffffffff;
              uVar26 = uVar26 & 0xffffffff;
              iVar8 = 0;
              do {
                iVar30 = (int)uVar26;
                iVar12 = iVar30;
                if (iVar7 < iVar30) {
                  iVar12 = iVar7;
                }
                local_1b8.w = pMVar6->w;
                local_1b8.h = pMVar6->h;
                sVar3 = pMVar6->elemsize;
                local_1b8.elempack = pMVar6->elempack;
                local_1b8.allocator = pMVar6->allocator;
                local_1b8.cstep = (long)local_1b8.h * (long)local_1b8.w;
                local_1b8.data =
                     (void *)((long)pMVar6->data +
                             sVar3 * local_1b8.cstep * (long)(iVar8 / iVar7) +
                             pMVar6->cstep *
                             (long)(int)((long)((ulong)(uint)(iVar13 >> 0x1f) << 0x20 | uVar17) /
                                        lVar10) * sVar3);
                local_1b8.refcount._0_4_ = 0;
                local_1b8.refcount._4_4_ = 0;
                local_1b8.elemsize._0_4_ = (undefined4)sVar3;
                local_1b8.elemsize._4_4_ = (int)(sVar3 >> 0x20);
                local_1b8.dims = 2;
                local_1b8.d = 1;
                local_1b8.c = 1;
                local_240.cstep = (long)local_2a8.h * (long)local_2a8.w;
                local_240.data =
                     (void *)((long)local_2a8.data +
                             local_2a8.elemsize * local_240.cstep * (long)(iVar8 / iVar7) +
                             local_2a8.cstep * (long)((int)uVar25 / (int)uVar27) *
                             local_2a8.elemsize);
                local_240.refcount = (int *)0x0;
                local_240.elemsize = local_2a8.elemsize;
                local_240.elempack = local_2a8.elempack;
                local_240.allocator = local_2a8.allocator;
                local_240.dims = 2;
                local_240.w = local_2a8.w;
                local_240.h = local_2a8.h;
                local_240.d = 1;
                local_240.c = 1;
                iVar31 = iVar7 + iVar8;
                iVar45 = (int)local_358;
                gemm_transB_packed_tile_int8
                          (&local_1b8,&local_240,top_blob_00,0x24,uVar18,(int)local_350,iVar8,iVar12
                           ,iVar45 <= iVar31);
                uVar26 = (ulong)(uint)-(iVar7 - iVar30);
                iVar8 = iVar31;
              } while (iVar31 < iVar45);
            }
            iVar7 = local_370->w;
            iVar8 = local_370->elempack;
            iVar13 = local_370->h;
            iVar30 = (int)local_370->cstep * iVar8;
            iVar12 = iVar7 + 6;
            if (-1 < iVar7 + 3) {
              iVar12 = iVar7 + 3;
            }
            iVar12 = iVar12 >> 2;
            iVar31 = (int)local_350;
            uVar27 = iVar31 * 4;
            local_260 = (ulong)uVar27;
            uVar17 = 0;
            iVar45 = (int)local_368;
            if (3 < (int)uVar18) {
              local_338 = (long)(iVar31 * 0x18);
              local_348 = CONCAT44(local_348._4_4_,iVar30);
              lVar15 = (long)iVar30;
              lVar10 = (long)(iVar30 * 2);
              lVar11 = (long)(iVar30 * 3);
              local_340 = local_350 & 0xffffffff;
              lVar38 = (long)(iVar31 * 8) * 4;
              lVar40 = (long)(iVar31 * 0xc) * 4;
              lVar19 = (long)(iVar31 * 0x10) * 4;
              lVar46 = (long)(iVar31 * 0x14) * 4;
              iVar14 = 0;
              local_3b0 = 0;
              do {
                if (0 < iVar31) {
                  pauVar29 = (undefined1 (*) [16])((long)&top_blob_00->data + (long)iVar14 * 4);
                  local_330 = (long)(((int)local_258 + (int)local_3b0) / iVar8);
                  uVar17 = 0;
                  do {
                    iVar9 = iVar45 + (int)uVar17;
                    lVar16 = -0x50;
                    pauVar42 = pauVar29;
                    do {
                      pauVar44 = pauVar42;
                      auVar47 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar44 + lVar38),
                                           *(undefined1 (*) [16])(*pauVar44 + (long)(int)uVar27 * 4)
                                          );
                      auVar49 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar44 + lVar19),
                                           *(undefined1 (*) [16])(*pauVar44 + lVar40));
                      auVar4 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar44 + (long)(int)uVar27 * 4),
                                          *(undefined1 (*) [16])(*pauVar44 + lVar38));
                      auVar48 = vpaddd_avx(auVar47,*pauVar44);
                      auVar51 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar44 + lVar40),
                                           *(undefined1 (*) [16])(*pauVar44 + lVar19));
                      auVar48 = vpaddd_avx(auVar48,auVar49);
                      auVar50 = vpaddd_avx(auVar51,auVar51);
                      auVar50 = vpaddd_avx(auVar50,auVar4);
                      auVar49 = vpslld_avx(auVar49,2);
                      auVar47 = vpaddd_avx(auVar49,auVar47);
                      auVar51 = vpslld_avx(auVar51,3);
                      auVar49 = vpslld_avx(*(undefined1 (*) [16])(*pauVar44 + lVar46),2);
                      auVar49 = vpaddd_avx(auVar4,auVar49);
                      auVar49 = vpaddd_avx(auVar51,auVar49);
                      *(undefined1 (*) [16])(local_168 + lVar16) = auVar48;
                      *(undefined1 (*) [16])(local_108[0] + lVar16) = auVar50;
                      *(undefined1 (*) [16])(local_a8[0] + lVar16) = auVar47;
                      *(undefined1 (*) [16])(local_48 + lVar16) = auVar49;
                      lVar16 = lVar16 + 0x10;
                      pauVar42 = (undefined1 (*) [16])(*pauVar44 + local_338 * 4);
                    } while (lVar16 != 0);
                    iVar5 = iVar9 % iVar12;
                    auVar47 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar44 + local_338 * 4 + lVar38),
                                         *(undefined1 (*) [16])
                                          (*pauVar44 + local_338 * 4 + (long)(int)uVar27 * 4));
                    auVar49 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar44 + local_338 * 4 + lVar19),
                                         *(undefined1 (*) [16])(*pauVar44 + local_338 * 4 + lVar40))
                    ;
                    auVar50 = vpsubd_avx(*(undefined1 (*) [16])
                                          (*pauVar44 + local_338 * 4 + (long)(int)uVar27 * 4),
                                         *(undefined1 (*) [16])(*pauVar44 + local_338 * 4 + lVar38))
                    ;
                    auVar48 = vpaddd_avx(auVar47,*(undefined1 (*) [16])(*pauVar44 + local_338 * 4));
                    auVar4 = vpsubd_avx(*(undefined1 (*) [16])(*pauVar44 + local_338 * 4 + lVar40),
                                        *(undefined1 (*) [16])(*pauVar44 + local_338 * 4 + lVar19));
                    auVar48 = vpaddd_avx(auVar48,auVar49);
                    local_168 = vpslld_avx(auVar48,2);
                    auVar51 = vpslld_avx(auVar4,3);
                    auVar48 = vpslld_avx(auVar50,2);
                    local_108[0] = vpaddd_avx(auVar51,auVar48);
                    auVar49 = vpslld_avx(auVar49,4);
                    auVar47 = vpslld_avx(auVar47,2);
                    local_a8[0] = vpaddd_avx(auVar49,auVar47);
                    auVar49 = vpslld_avx(*(undefined1 (*) [16])(*pauVar44 + local_338 * 4 + lVar46),
                                         4);
                    auVar47 = vpslld_avx(auVar4,5);
                    auVar47 = vpaddd_avx(auVar47,auVar48);
                    local_48 = vpaddd_avx(auVar47,auVar49);
                    uVar20 = iVar9 / iVar12 << 2;
                    pauVar42 = (undefined1 (*) [16])
                               ((long)local_370->data +
                               (long)(iVar5 * 4 * iVar8) * 4 +
                               (long)local_370->w * local_370->elemsize * (long)(int)uVar20 +
                               local_370->cstep * local_330 * local_370->elemsize);
                    iVar21 = iVar5 * 4 + 1;
                    iVar28 = iVar5 * 4 + 2;
                    iVar9 = iVar5 * 4 + 3;
                    pauVar44 = &local_168;
                    lVar16 = 0;
                    do {
                      if ((int)(uVar20 | (uint)lVar16) < iVar13) {
                        auVar47 = vpaddd_avx(pauVar44[-3],pauVar44[-4]);
                        auVar49 = vpaddd_avx(pauVar44[-1],pauVar44[-2]);
                        auVar4 = vpsubd_avx(pauVar44[-4],pauVar44[-3]);
                        auVar51 = vpsubd_avx(pauVar44[-2],pauVar44[-1]);
                        auVar48 = vpaddd_avx(auVar47,pauVar44[-5]);
                        auVar48 = vpaddd_avx(auVar48,auVar49);
                        auVar50 = vpaddd_avx(auVar51,auVar51);
                        auVar50 = vpaddd_avx(auVar50,auVar4);
                        auVar49 = vpslld_avx(auVar49,2);
                        auVar49 = vpaddd_avx(auVar49,auVar47);
                        auVar51 = vpslld_avx(auVar51,3);
                        auVar47 = vpaddd_avx(auVar4,*pauVar44);
                        auVar4 = vpaddd_avx(auVar47,auVar51);
                        auVar47 = vcvtdq2ps_avx(auVar48);
                        auVar52._0_4_ = (int)(auVar47._0_4_ * 0.0017361111);
                        auVar52._4_4_ = (int)(auVar47._4_4_ * 0.0017361111);
                        auVar52._8_4_ = (int)(auVar47._8_4_ * 0.0017361111);
                        auVar52._12_4_ = (int)(auVar47._12_4_ * 0.0017361111);
                        auVar47 = vcvtdq2ps_avx(auVar50);
                        auVar51._0_4_ = (int)(auVar47._0_4_ * 0.0017361111);
                        auVar51._4_4_ = (int)(auVar47._4_4_ * 0.0017361111);
                        auVar51._8_4_ = (int)(auVar47._8_4_ * 0.0017361111);
                        auVar51._12_4_ = (int)(auVar47._12_4_ * 0.0017361111);
                        auVar47 = vcvtdq2ps_avx(auVar49);
                        auVar50._0_4_ = (int)(auVar47._0_4_ * 0.0017361111);
                        auVar50._4_4_ = (int)(auVar47._4_4_ * 0.0017361111);
                        auVar50._8_4_ = (int)(auVar47._8_4_ * 0.0017361111);
                        auVar50._12_4_ = (int)(auVar47._12_4_ * 0.0017361111);
                        auVar47 = vcvtdq2ps_avx(auVar4);
                        auVar48._0_4_ = (int)(auVar47._0_4_ * 0.0017361111);
                        auVar48._4_4_ = (int)(auVar47._4_4_ * 0.0017361111);
                        auVar48._8_4_ = (int)(auVar47._8_4_ * 0.0017361111);
                        auVar48._12_4_ = (int)(auVar47._12_4_ * 0.0017361111);
                        if (iVar8 == 1) {
                          *(int *)*pauVar42 = auVar52._0_4_;
                          *(int *)(*pauVar42 + lVar15 * 4) = auVar52._4_4_;
                          *(int *)(*pauVar42 + lVar10 * 4) = auVar52._8_4_;
                          *(int *)(*pauVar42 + lVar11 * 4) = auVar52._12_4_;
                          if (iVar21 < iVar7) {
                            *(int *)(*pauVar42 + 4) = auVar51._0_4_;
                            *(int *)(*pauVar42 + lVar15 * 4 + 4) = auVar51._4_4_;
                            *(int *)(*pauVar42 + lVar10 * 4 + 4) = auVar51._8_4_;
                            *(int *)(*pauVar42 + lVar11 * 4 + 4) = auVar51._12_4_;
                          }
                          if (iVar28 < iVar7) {
                            *(int *)(*pauVar42 + 8) = auVar50._0_4_;
                            *(int *)(*pauVar42 + lVar15 * 4 + 8) = auVar50._4_4_;
                            *(int *)(*pauVar42 + lVar10 * 4 + 8) = auVar50._8_4_;
                            *(int *)(*pauVar42 + lVar11 * 4 + 8) = auVar50._12_4_;
                          }
                          if (iVar9 < iVar7) {
                            *(int *)(*pauVar42 + 0xc) = auVar48._0_4_;
                            *(int *)(*pauVar42 + lVar15 * 4 + 0xc) = auVar48._4_4_;
                            *(int *)(*pauVar42 + lVar10 * 4 + 0xc) = auVar48._8_4_;
                            *(int *)(*pauVar42 + lVar11 * 4 + 0xc) = auVar48._12_4_;
                          }
                        }
                        else if (iVar8 == 4) {
                          *pauVar42 = auVar52;
                          if (iVar21 < iVar7) {
                            pauVar42[1] = auVar51;
                          }
                          if (iVar28 < iVar7) {
                            pauVar42[2] = auVar50;
                          }
                          if (iVar9 < iVar7) {
                            pauVar42[3] = auVar48;
                          }
                        }
                        pauVar42 = (undefined1 (*) [16])(*pauVar42 + (long)(iVar8 * iVar7) * 4);
                      }
                      lVar16 = lVar16 + 1;
                      pauVar44 = pauVar44 + 6;
                    } while (lVar16 != 4);
                    uVar17 = uVar17 + 1;
                    pauVar29 = pauVar29 + 1;
                  } while (uVar17 != local_340);
                }
                uVar17 = local_3b0 + 4;
                uVar26 = local_3b0 + 7;
                iVar14 = iVar14 + iVar31 * 0x90;
                local_3b0 = uVar17;
              } while (uVar26 < local_248);
            }
            if ((int)((uint)uVar17 | 1) < (int)uVar18) {
              lVar19 = (long)(iVar31 * 2);
              lVar15 = (long)(iVar31 * 6);
              lVar10 = (long)(iVar31 * 8);
              lVar11 = (long)(iVar31 * 10);
              local_1c0 = (long)(iVar31 * 0xc);
              local_1e0 = local_370->data;
              local_1c8 = local_370->elemsize;
              local_1e8 = local_370->cstep * local_1c8;
              local_1d0 = local_350 & 0xffffffff;
              local_324 = (uint)uVar17 * iVar31 * 0x24;
              local_2ac = iVar31 * 0x48;
              local_2c0 = lVar19 * 4;
              local_2c8 = uVar17 & 0xffffffff;
              do {
                if (0 < iVar31) {
                  piVar35 = (int *)((long)&top_blob_00->data + (long)local_324 * 4);
                  local_2b8 = (void *)((local_250 + local_2c8) * local_1e8 + (long)local_1e0);
                  uVar17 = 0;
                  do {
                    local_348 = uVar17;
                    iVar8 = (int)local_348 + iVar45;
                    lVar38 = -0x28;
                    piVar22 = piVar35;
                    do {
                      piVar43 = piVar22;
                      iVar14 = piVar43[(int)uVar27] + piVar43[lVar19];
                      iVar9 = piVar43[(long)(int)uVar27 + 1] + piVar43[lVar19 + 1];
                      iVar32 = piVar43[lVar19] - piVar43[(int)uVar27];
                      iVar23 = piVar43[lVar19 + 1] - piVar43[(long)(int)uVar27 + 1];
                      iVar5 = piVar43[lVar10] + piVar43[lVar15];
                      iVar36 = piVar43[lVar15] - piVar43[lVar10];
                      iVar21 = piVar43[lVar10 + 1] + piVar43[lVar15 + 1];
                      iVar34 = piVar43[lVar15 + 1] - piVar43[lVar10 + 1];
                      iVar28 = piVar43[lVar11];
                      iVar24 = piVar43[lVar11 + 1];
                      iVar33 = piVar43[1];
                      *(int *)((long)aiStack_170 + lVar38 + -0x20) = iVar5 + iVar14 + *piVar43;
                      *(int *)((long)aiStack_170 + lVar38 + -0x1c) = iVar21 + iVar9 + iVar33;
                      *(int *)(local_168 + lVar38 + 8) = iVar32 + iVar36 * 2;
                      *(int *)(local_168 + lVar38 + 0xc) = iVar23 + iVar34 * 2;
                      *(int *)((long)aiStack_158 + lVar38 + 0x28) = iVar14 + iVar5 * 4;
                      *(int *)((long)aiStack_158 + lVar38 + 0x2c) = iVar9 + iVar21 * 4;
                      *(int *)(local_108[0] + lVar38 + 8) = iVar32 + iVar36 * 8 + iVar28 * 4;
                      *(int *)(local_108[0] + lVar38 + 0xc) = iVar23 + iVar34 * 8 + iVar24 * 4;
                      piVar22 = piVar43 + local_1c0;
                      lVar38 = lVar38 + 8;
                    } while (lVar38 != 0);
                    iVar28 = iVar8 % iVar12;
                    iVar5 = piVar43[(int)uVar27 + local_1c0] + piVar43[lVar19 + local_1c0];
                    iVar21 = piVar43[(long)(int)uVar27 + local_1c0 + 1] +
                             piVar43[lVar19 + local_1c0 + 1];
                    iVar23 = piVar43[lVar19 + local_1c0] - piVar43[(int)uVar27 + local_1c0];
                    iVar14 = piVar43[lVar10 + local_1c0] + piVar43[lVar15 + local_1c0];
                    iVar24 = piVar43[lVar19 + local_1c0 + 1] -
                             piVar43[(long)(int)uVar27 + local_1c0 + 1];
                    iVar9 = piVar43[lVar10 + local_1c0 + 1] + piVar43[lVar15 + local_1c0 + 1];
                    iVar32 = piVar43[lVar15 + local_1c0] - piVar43[lVar10 + local_1c0];
                    iVar33 = piVar43[lVar15 + local_1c0 + 1] - piVar43[lVar10 + local_1c0 + 1];
                    local_1b8.dims = (iVar5 + iVar14 + *piVar22) * 4;
                    local_1b8.w = (iVar9 + iVar21 + piVar22[1]) * 4;
                    local_168._8_4_ = iVar23 * 4 + iVar32 * 8;
                    local_168._12_4_ = iVar24 * 4 + iVar33 * 8;
                    aiStack_158[10] = iVar14 * 0x10 + iVar5 * 4;
                    aiStack_158[0xb] = iVar9 * 0x10 + iVar21 * 4;
                    local_108[0]._8_4_ =
                         iVar32 * 0x20 + iVar23 * 4 + piVar43[lVar11 + local_1c0] * 0x10;
                    local_108[0]._12_4_ =
                         iVar33 * 0x20 + iVar24 * 4 + piVar43[lVar11 + local_1c0 + 1] * 0x10;
                    uVar20 = iVar8 / iVar12 << 2;
                    piVar22 = (int *)((long)local_2b8 +
                                     (long)(iVar28 * 4) * 4 +
                                     (long)local_370->w * local_1c8 * (long)(int)uVar20);
                    iVar8 = iVar28 * 4 + 1;
                    local_330 = CONCAT44(local_330._4_4_,iVar8);
                    iVar14 = iVar28 * 4 + 2;
                    local_338 = CONCAT44(local_338._4_4_,iVar14);
                    iVar9 = iVar28 * 4 + 3;
                    local_340 = CONCAT44(local_340._4_4_,iVar9);
                    piVar43 = &local_1b8.w;
                    lVar38 = 0;
                    do {
                      if ((int)(uVar20 | (uint)lVar38) < iVar13) {
                        iVar5 = (int)*(size_t *)(piVar43 + -7) + piVar43[-9];
                        iVar21 = piVar43[-6] + piVar43[-8];
                        iVar28 = piVar43[-3] + piVar43[-5];
                        iVar24 = piVar43[-2] + piVar43[-4];
                        iVar37 = piVar43[-9] - (int)*(size_t *)(piVar43 + -7);
                        iVar36 = piVar43[-8] - piVar43[-6];
                        iVar33 = piVar43[-10];
                        iVar39 = piVar43[-5] - piVar43[-3];
                        iVar23 = piVar43[-1];
                        iVar34 = piVar43[-4] - piVar43[-2];
                        iVar32 = *piVar43;
                        *piVar22 = (iVar5 + iVar28 + *(int *)&((Mat *)(piVar43 + -0xb))->data) /
                                   0x240;
                        piVar22[iVar30] = (iVar21 + iVar24 + iVar33) / 0x240;
                        if (iVar8 < iVar7) {
                          piVar22[1] = (iVar37 + iVar39 * 2) / 0x240;
                          piVar22[(long)iVar30 + 1] = (iVar36 + iVar34 * 2) / 0x240;
                        }
                        if (iVar14 < iVar7) {
                          piVar22[2] = (iVar5 + iVar28 * 4) / 0x240;
                          piVar22[(long)iVar30 + 2] = (iVar21 + iVar24 * 4) / 0x240;
                        }
                        if (iVar9 < iVar7) {
                          piVar22[3] = (iVar37 + iVar39 * 8 + iVar23) / 0x240;
                          piVar22[(long)iVar30 + 3] = (iVar36 + iVar34 * 8 + iVar32) / 0x240;
                        }
                        piVar22 = piVar22 + iVar7;
                      }
                      lVar38 = lVar38 + 1;
                      piVar43 = piVar43 + 0xc;
                    } while (lVar38 != 4);
                    piVar35 = piVar35 + 2;
                    uVar17 = local_348 + 1;
                  } while (local_348 + 1 != local_1d0);
                }
                uVar17 = local_2c8 + 2;
                lVar38 = local_2c8 + 3;
                local_324 = local_324 + local_2ac;
                local_2c8 = uVar17;
              } while (lVar38 < local_1d8);
            }
            if ((int)uVar17 < (int)uVar18) {
              local_348 = CONCAT44(local_348._4_4_,iVar31 * 0x24);
              lVar10 = (long)(int)uVar27;
              local_338 = (long)(iVar31 * 6);
              local_2b8 = local_370->data;
              local_340 = local_370->elemsize;
              local_2c0 = local_370->cstep * local_340;
              local_3b0 = uVar17 & 0xffffffff;
              iVar8 = (int)uVar17 * iVar31 * 0x24;
              local_330 = lVar10 * 4;
              do {
                if (0 < iVar31) {
                  piVar35 = (int *)((long)&top_blob_00->data + (long)iVar8 * 4);
                  uVar17 = 0;
                  do {
                    iVar30 = (int)uVar17 + iVar45;
                    lVar11 = -0x14;
                    piVar22 = piVar35;
                    do {
                      piVar43 = piVar22;
                      iVar14 = piVar43[iVar31 * 2] + piVar43[iVar31];
                      iVar9 = piVar43[lVar10] + piVar43[iVar31 * 3];
                      iVar21 = piVar43[iVar31] - piVar43[iVar31 * 2];
                      iVar28 = piVar43[iVar31 * 3] - piVar43[lVar10];
                      iVar5 = piVar43[iVar31 * 5];
                      *(int *)((long)aiStack_170 + lVar11 + -0x34) = iVar9 + iVar14 + *piVar43;
                      *(int *)((long)aiStack_170 + lVar11 + -0x1c) = iVar21 + iVar28 * 2;
                      *(int *)((long)aiStack_170 + lVar11 + -4) = iVar14 + iVar9 * 4;
                      *(int *)(local_168 + lVar11 + 0xc) = iVar21 + iVar28 * 8 + iVar5 * 4;
                      lVar11 = lVar11 + 4;
                      piVar22 = piVar43 + local_338;
                    } while (lVar11 != 0);
                    iVar5 = iVar30 % iVar12;
                    iVar14 = piVar43[iVar31 * 2 + local_338] + piVar43[iVar31 + local_338];
                    iVar21 = piVar43[iVar31 + local_338] - piVar43[iVar31 * 2 + local_338];
                    iVar9 = piVar43[lVar10 + local_338] + piVar43[iVar31 * 3 + local_338];
                    iVar28 = piVar43[iVar31 * 3 + local_338] - piVar43[lVar10 + local_338];
                    local_1b8.elemsize._4_4_ = (iVar9 + iVar14 + piVar43[local_338]) * 4;
                    local_1b8.w = iVar21 * 4 + iVar28 * 8;
                    local_1b8.cstep =
                         CONCAT44(iVar9 * 0x10 + iVar14 * 4,(undefined4)local_1b8.cstep);
                    local_168._12_4_ =
                         iVar28 * 0x20 + iVar21 * 4 + piVar43[iVar31 * 5 + local_338] * 0x10;
                    uVar27 = iVar30 / iVar12 << 2;
                    piVar22 = (int *)((long)local_2b8 +
                                     (long)(iVar5 * 4) * 4 +
                                     (long)local_370->w * local_340 * (long)(int)uVar27 +
                                     (local_250 + local_3b0) * local_2c0);
                    piVar43 = (int *)((long)&local_1b8.elemsize + 4);
                    lVar11 = 0;
                    do {
                      if ((int)(uVar27 | (uint)lVar11) < iVar13) {
                        iVar30 = piVar43[-3] + piVar43[-4];
                        iVar14 = piVar43[-1] + piVar43[-2];
                        iVar21 = piVar43[-4] - piVar43[-3];
                        iVar28 = piVar43[-2] - piVar43[-1];
                        iVar9 = *piVar43;
                        *piVar22 = (iVar14 + iVar30 + piVar43[-5]) / 0x240;
                        if (iVar5 * 4 + 1 < iVar7) {
                          piVar22[1] = (iVar21 + iVar28 * 2) / 0x240;
                        }
                        if (iVar5 * 4 + 2 < iVar7) {
                          piVar22[2] = (iVar30 + iVar14 * 4) / 0x240;
                        }
                        if (iVar5 * 4 + 3 < iVar7) {
                          piVar22[3] = (iVar21 + iVar28 * 8 + iVar9) / 0x240;
                        }
                        piVar22 = piVar22 + iVar7;
                      }
                      lVar11 = lVar11 + 1;
                      piVar43 = piVar43 + 6;
                    } while (lVar11 != 4);
                    uVar17 = uVar17 + 1;
                    piVar35 = piVar35 + 1;
                  } while (uVar17 != (local_350 & 0xffffffff));
                }
                local_3b0 = local_3b0 + 1;
                iVar8 = iVar8 + iVar31 * 0x24;
              } while (local_3b0 != local_248);
            }
            uVar25 = (ulong)(iVar45 + local_31c);
            uVar26 = local_358;
            uVar17 = local_360;
            uVar27 = local_31c;
          } while ((int)(iVar45 + local_31c) < (int)local_360);
        }
        iVar7 = local_2b0 + 1;
      } while (iVar7 != local_328);
    }
    iVar13 = 0;
  }
  piVar35 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar35 != (int *)0x0) {
    LOCK();
    *piVar35 = *piVar35 + -1;
    UNLOCK();
    if (*piVar35 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        if (local_318.data != (void *)0x0) {
          free(local_318.data);
        }
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00221f96:
  piVar35 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
  if (piVar35 != (int *)0x0) {
    LOCK();
    *piVar35 = *piVar35 + -1;
    UNLOCK();
    if (*piVar35 == 0) {
      if (local_2a8.allocator == (Allocator *)0x0) {
        if (local_2a8.data != (void *)0x0) {
          free(local_2a8.data);
        }
      }
      else {
        (*(local_2a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

static int conv3x3s1_winograd43_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int nT, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        return conv3x3s1_winograd43_int8_avx512vnni(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        return conv3x3s1_winograd43_int8_avxvnni(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        return conv3x3s1_winograd43_int8_avx2(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__ && !__AVX2__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_xop())
    {
        return conv3x3s1_winograd43_int8_xop(bottom_blob, top_blob, AT, nT, opt);
    }
#endif

    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 4n+2, winograd F(4,3)
    int w_tiles = (outw + 3) / 4;
    int h_tiles = (outh + 3) / 4;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 36;

    // NCNN_LOGE("conv3x3s1_winograd43_int8 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk_int8(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd43_transform_input_tile_int8(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile_int8(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd43_transform_input_tile_int8(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile_int8(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                bool k_end = k + TILE_K >= K;

                gemm_transB_packed_tile_int8(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk, k_end);
            }

            // transform output
            conv3x3s1_winograd43_transform_output_tile_int8(top_tile, top_blob, i, max_ii, j, max_jj);
        }
    }

    return 0;
}